

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O0

bool senjo::NumberParam<unsigned_long>
               (string *name,unsigned_long *value,char **params,bool *invalid)

{
  char *pcVar1;
  unsigned_long uVar2;
  bool bVar3;
  int iVar4;
  int local_34;
  int sign;
  bool *invalid_local;
  char **params_local;
  unsigned_long *value_local;
  string *name_local;
  
  bVar3 = ParamMatch(name,params);
  if (bVar3) {
    local_34 = 1;
    if ((*params != (char *)0x0) && (**params == '-')) {
      local_34 = -1;
      *params = *params + 1;
    }
    if (((*params == (char *)0x0) || (**params == '\0')) ||
       (iVar4 = isdigit((int)**params), iVar4 == 0)) {
      *invalid = true;
    }
    else {
      pcVar1 = *params;
      *params = pcVar1 + 1;
      *value = (long)(*pcVar1 + -0x30);
      while( true ) {
        bVar3 = false;
        if (**params != '\0') {
          iVar4 = isdigit((int)**params);
          bVar3 = iVar4 != 0;
        }
        if (!bVar3) break;
        uVar2 = *value;
        pcVar1 = *params;
        *params = pcVar1 + 1;
        *value = uVar2 * 10 + (long)(*pcVar1 + -0x30);
      }
      if ((**params == '\0') || (iVar4 = isspace((int)**params), iVar4 != 0)) {
        *value = (long)local_34 * *value;
        NextWord(params);
      }
      else {
        *invalid = true;
      }
    }
    name_local._7_1_ = true;
  }
  else {
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

static inline bool NumberParam(const std::string& name, Number& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  int sign = 1;
  if (params && (*params == '-')) {
    sign = -1;
    ++params;
  }
  if (!params || !*params || !isdigit(*params)) {
    invalid = true;
  }
  else {
    value = (*params++ - '0');
    while (*params && isdigit(*params)) {
      value = ((10 * value) + (*params++ - '0'));
    }
    if (*params && !isspace(*params)) {
      invalid = true;
    }
    else {
      value *= sign;
      NextWord(params);
    }
  }
  return true;
}